

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O3

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar1;
  uint8_t *puVar2;
  cs_detail *pcVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  MCOperand *op;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var4 = MCOperand_isReg(op);
  if (!_Var4) {
    _Var4 = MCOperand_isImm(op);
    if (!_Var4) {
      return;
    }
    uVar7 = MCOperand_getImm(op);
    if ((long)uVar7 < 0) {
      uVar8 = -uVar7;
      if (uVar7 < 0xfffffffffffffff7) {
        pcVar9 = "-0x%lx";
      }
      else {
        pcVar9 = "-%lu";
      }
    }
    else {
      uVar8 = uVar7;
      if (uVar7 < 10) {
        pcVar9 = "%lu";
      }
      else {
        pcVar9 = "0x%lx";
      }
    }
    SStream_concat(O,pcVar9,uVar8);
    if (MI->csh->detail == CS_OPT_OFF) {
      return;
    }
    pcVar3 = MI->flat_insn->detail;
    puVar2 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x20 + 0x11;
    puVar2[0] = '\x02';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    goto LAB_0026a6b2;
  }
  uVar5 = MCOperand_getReg(op);
  uVar7 = (ulong)uVar5;
  uVar6 = MCInst_getOpcode(MI);
  if (OpNo == 1 && uVar6 == 0x9b) {
    if (uVar5 == 5) {
      pcVar9 = "EFR";
    }
    else {
      if (uVar5 != 0xe) goto LAB_0026a5eb;
      pcVar9 = "IFR";
    }
  }
  else {
LAB_0026a5eb:
    pcVar9 = getRegisterName_AsmStrs +
             *(ushort *)(getRegisterName_RegAsmOffset + (ulong)(uVar5 - 1) * 2);
  }
  SStream_concat0(O,pcVar9);
  if (MI->csh->detail == CS_OPT_OFF) {
    return;
  }
  pcVar3 = MI->flat_insn->detail;
  puVar2 = pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x20 + 0x11;
  puVar2[0] = '\x01';
  puVar2[1] = '\0';
  puVar2[2] = '\0';
  puVar2[3] = '\0';
LAB_0026a6b2:
  pcVar3 = MI->flat_insn->detail;
  *(int *)(pcVar3->groups + (ulong)(pcVar3->field_6).x86.prefix[0] * 0x20 + 0x15) = (int)uVar7;
  paVar1 = &MI->flat_insn->detail->field_6;
  (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
  return;
}

Assistant:

static void _printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op  = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		printRegName(O, MCOperand_getReg(Op));
	} else if (MCOperand_isImm(Op)) {
		uint8_t encsize;
		uint8_t opsize = X86_immediate_size(MCInst_getOpcode(MI), &encsize);

		// Print X86 immediates as signed values.
		int64_t imm = MCOperand_getImm(Op);
		if (imm < 0) {
			if (MI->csh->imm_unsigned) {
				if (opsize) {
					switch(opsize) {
						default:
							break;
						case 1:
							imm &= 0xff;
							break;
						case 2:
							imm &= 0xffff;
							break;
						case 4:
							imm &= 0xffffffff;
							break;
					}
				}

				SStream_concat(O, "$0x%"PRIx64, imm);
			} else {
				if (imm < -HEX_THRESHOLD)
					SStream_concat(O, "$-0x%"PRIx64, -imm);
				else
					SStream_concat(O, "$-%"PRIu64, -imm);
			}
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "$0x%"PRIx64, imm);
			else
				SStream_concat(O, "$%"PRIu64, imm);
		}
	}
}